

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progress.c
# Opt level: O2

_Bool progress_calc(Curl_easy *data,curltime now)

{
  int iVar1;
  curl_off_t size;
  curl_off_t size_00;
  long lVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  timediff_t tVar5;
  curl_off_t cVar6;
  curl_off_t cVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  int iVar11;
  long lVar12;
  ulong uVar13;
  curltime newer;
  curltime newer_00;
  curltime older;
  curltime older_00;
  
  lVar12 = now.tv_sec;
  uVar3 = (data->progress).start.tv_sec;
  uVar4 = (data->progress).start.tv_usec;
  older.tv_usec = uVar4;
  older.tv_sec = uVar3;
  newer._8_8_ = now._8_8_ & 0xffffffff;
  newer.tv_sec = lVar12;
  older._12_4_ = 0;
  tVar5 = Curl_timediff_us(newer,older);
  (data->progress).timespent = tVar5;
  size = (data->progress).dl.cur_size;
  cVar6 = trspeed(size,tVar5);
  (data->progress).dl.speed = cVar6;
  size_00 = (data->progress).ul.cur_size;
  cVar7 = trspeed(size_00,tVar5);
  (data->progress).ul.speed = cVar7;
  lVar2 = (data->progress).lastshow;
  if (lVar2 != lVar12) {
    iVar1 = (data->progress).speeder_c;
    iVar11 = iVar1 % 6;
    (data->progress).lastshow = lVar12;
    (data->progress).speeder[iVar11] = size_00 + size;
    (data->progress).speeder_time[iVar11].tv_sec = lVar12;
    (data->progress).speeder_time[iVar11].tv_usec = now.tv_usec;
    (data->progress).speeder_c = iVar1 + 1U;
    if (iVar1 == 0) {
      lVar10 = cVar7 + cVar6;
    }
    else {
      uVar13 = (ulong)(iVar1 + 1U) % 6;
      if (iVar1 < 5) {
        uVar13 = 0;
      }
      uVar8 = (ulong)(uint)((int)uVar13 << 4);
      newer_00._12_4_ = 0;
      newer_00.tv_sec = SUB128(now._0_12_,0);
      newer_00.tv_usec = SUB124(now._0_12_,8);
      older_00.tv_usec = *(undefined4 *)((long)&(data->progress).speeder_time[0].tv_usec + uVar8);
      older_00.tv_sec = *(undefined8 *)((long)&(data->progress).speeder_time[0].tv_sec + uVar8);
      older_00._12_4_ = 0;
      tVar5 = Curl_timediff(newer_00,older_00);
      lVar10 = tVar5 + (ulong)(tVar5 == 0);
      lVar9 = (data->progress).speeder[iVar11] - (data->progress).speeder[uVar13];
      if (lVar9 < 0x418938) {
        lVar10 = (lVar9 * 1000) / lVar10;
      }
      else {
        lVar10 = (long)((double)lVar9 / ((double)lVar10 / 1000.0));
      }
    }
    (data->progress).current_speed = lVar10;
  }
  return lVar2 != lVar12;
}

Assistant:

static bool progress_calc(struct Curl_easy *data, struct curltime now)
{
  bool timetoshow = FALSE;
  struct Progress * const p = &data->progress;

  /* The time spent so far (from the start) in microseconds */
  p->timespent = Curl_timediff_us(now, p->start);
  p->dl.speed = trspeed(p->dl.cur_size, p->timespent);
  p->ul.speed = trspeed(p->ul.cur_size, p->timespent);

  /* Calculations done at most once a second, unless end is reached */
  if(p->lastshow != now.tv_sec) {
    int countindex; /* amount of seconds stored in the speeder array */
    int nowindex = p->speeder_c% CURR_TIME;
    p->lastshow = now.tv_sec;
    timetoshow = TRUE;

    /* Let's do the "current speed" thing, with the dl + ul speeds
       combined. Store the speed at entry 'nowindex'. */
    p->speeder[ nowindex ] = p->dl.cur_size + p->ul.cur_size;

    /* remember the exact time for this moment */
    p->speeder_time [ nowindex ] = now;

    /* advance our speeder_c counter, which is increased every time we get
       here and we expect it to never wrap as 2^32 is a lot of seconds! */
    p->speeder_c++;

    /* figure out how many index entries of data we have stored in our speeder
       array. With N_ENTRIES filled in, we have about N_ENTRIES-1 seconds of
       transfer. Imagine, after one second we have filled in two entries,
       after two seconds we have filled in three entries etc. */
    countindex = ((p->speeder_c >= CURR_TIME) ? CURR_TIME : p->speeder_c) - 1;

    /* first of all, we do not do this if there is no counted seconds yet */
    if(countindex) {
      int checkindex;
      timediff_t span_ms;
      curl_off_t amount;

      /* Get the index position to compare with the 'nowindex' position.
         Get the oldest entry possible. While we have less than CURR_TIME
         entries, the first entry will remain the oldest. */
      checkindex = (p->speeder_c >= CURR_TIME) ? p->speeder_c%CURR_TIME : 0;

      /* Figure out the exact time for the time span */
      span_ms = Curl_timediff(now, p->speeder_time[checkindex]);
      if(0 == span_ms)
        span_ms = 1; /* at least one millisecond MUST have passed */

      /* Calculate the average speed the last 'span_ms' milliseconds */
      amount = p->speeder[nowindex]- p->speeder[checkindex];

      if(amount > CURL_OFF_T_C(4294967) /* 0xffffffff/1000 */)
        /* the 'amount' value is bigger than would fit in 32 bits if
           multiplied with 1000, so we use the double math for this */
        p->current_speed = (curl_off_t)
          ((double)amount/((double)span_ms/1000.0));
      else
        /* the 'amount' value is small enough to fit within 32 bits even
           when multiplied with 1000 */
        p->current_speed = amount*CURL_OFF_T_C(1000)/span_ms;
    }
    else
      /* the first second we use the average */
      p->current_speed = p->ul.speed + p->dl.speed;

  } /* Calculations end */
  return timetoshow;
}